

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O3

void __thiscall zmq::mechanism_t::peer_routing_id(mechanism_t *this,msg_t *msg_)

{
  int iVar1;
  void *__dest;
  
  iVar1 = msg_t::init_size(msg_,(this->_routing_id)._size);
  if (iVar1 != 0) {
    peer_routing_id();
  }
  __dest = msg_t::data(msg_);
  memcpy(__dest,(this->_routing_id)._data,(this->_routing_id)._size);
  msg_t::set_flags(msg_,'@');
  return;
}

Assistant:

void zmq::mechanism_t::peer_routing_id (msg_t *msg_)
{
    const int rc = msg_->init_size (_routing_id.size ());
    errno_assert (rc == 0);
    memcpy (msg_->data (), _routing_id.data (), _routing_id.size ());
    msg_->set_flags (msg_t::routing_id);
}